

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

bool __thiscall wasm::DataFlow::Node::returnsI1(Node *this)

{
  Id IVar1;
  Binary *this_00;
  bool bVar2;
  
  if (this->type == Expr) {
    this_00 = (Binary *)(this->field_1).expr;
    IVar1 = (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
    if (IVar1 == UnaryId) {
      bVar2 = Unary::isRelational((Unary *)this_00);
      return bVar2;
    }
    if (IVar1 == BinaryId) {
      bVar2 = Binary::isRelational(this_00);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool returnsI1() {
    if (isExpr()) {
      if (auto* binary = expr->dynCast<Binary>()) {
        return binary->isRelational();
      } else if (auto* unary = expr->dynCast<Unary>()) {
        return unary->isRelational();
      }
    }
    return false;
  }